

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Object * xt::vector::assocN(Object *__return_storage_ptr__,Vector *v,uint i,Object *val)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Vector *p_Var5;
  RuntimeException *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  double __z;
  allocator local_139;
  _Vector *local_138;
  ObjectArray newTail;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_100;
  Node local_f0;
  shared_ptr<xt::_Vector> local_e0;
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d0;
  shared_ptr<xt::_Vector> local_c0;
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b0;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<xt::_Vector> local_90;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_80;
  Object local_70;
  Object local_50;
  
  uVar1 = ((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->cnt;
  if (i < uVar1) {
    std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,&v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>);
    uVar1 = (local_80._M_ptr)->cnt;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    if ((uVar1 < 0x20) || ((uVar1 - 1 & 0xffffffe0) <= i)) {
      peVar4 = (((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tail).
               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      new_object_array((xt *)&newTail,
                       (uint)((ulong)((long)*(pointer *)
                                             ((long)&(peVar4->
                                                  super__Vector_base<xt::Object,_std::allocator<xt::Object>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                     *(long *)&(peVar4->
                                               super__Vector_base<xt::Object,_std::allocator<xt::Object>_>
                                               )._M_impl.super__Vector_impl_data) >> 5));
      std::vector<xt::Object,_std::allocator<xt::Object>_>::operator=
                (newTail.
                 super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->tail).
                         super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      Object::operator=((Object *)
                        (&(((newTail.
                             super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>).
                           _M_impl.super__Vector_impl_data._M_start)->type + ((i & 0x1f) << 5)),val)
      ;
      p_Var5 = (_Vector *)operator_new(0x28);
      peVar3 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = peVar3->cnt;
      uVar2 = peVar3->shift;
      std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,&(peVar3->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>
                );
      std::
      __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_b0,
                     &newTail.
                      super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      _Vector::_Vector(p_Var5,uVar1,uVar2,(Node *)&local_a0,(ObjectArray *)&local_b0);
      std::__shared_ptr<xt::_Vector,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_Vector,void>
                ((__shared_ptr<xt::_Vector,(__gnu_cxx::_Lock_policy)2> *)&local_90,p_Var5);
      Object::Object<xt::_Vector>(__return_storage_ptr__,&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      this_00 = &newTail.
                 super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
    }
    else {
      local_138 = (_Vector *)operator_new(0x28);
      peVar3 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = peVar3->cnt;
      uVar2 = peVar3->shift;
      std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,
                 &(peVar3->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
      Object::Object(&local_50,val);
      doAssoc((vector *)&local_f0,uVar2,(Node *)&local_100,i,&local_50);
      std::
      __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_d0,
                     &(((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      tail).
                      super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      p_Var5 = local_138;
      _Vector::_Vector(local_138,uVar1,uVar2,&local_f0,(ObjectArray *)&local_d0);
      std::__shared_ptr<xt::_Vector,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_Vector,void>
                ((__shared_ptr<xt::_Vector,(__gnu_cxx::_Lock_policy)2> *)&local_c0,p_Var5);
      Object::Object<xt::_Vector>(__return_storage_ptr__,&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c0.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      this_00 = &local_100._M_refcount;
    }
  }
  else {
    if (uVar1 != i) {
      this = (RuntimeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&newTail,"Index out of bounds",&local_139);
      RuntimeException::RuntimeException(this,(string *)&newTail);
      __cxa_throw(this,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_110,&v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>);
    Object::Object(&local_70,val);
    conj(__z);
    Object::Object<xt::_Vector>(__return_storage_ptr__,&local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_e0.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_00 = &local_110._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return __return_storage_ptr__;
}

Assistant:

Object assocN(Vector v, unsigned int i, Object val) {
	if (i < v->cnt) {
		if (i >= tailoff(v)) {
			ObjectArray newTail = new_object_array(v->tail->size());
			*newTail = *v->tail;
			(*newTail)[i & 0x01f] = val;
			return Vector(new _Vector {v->cnt, v->shift, v->root, newTail});
		}
		return Vector(new _Vector {v->cnt, v->shift, doAssoc(v->shift, v->root, i, val), v->tail});
	}
	if (i == v->cnt) return conj(v, val);
	throw RuntimeException("Index out of bounds");
}